

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::setTex1DBinding(ReferenceContext *this,int unitNdx,Texture1D *texture)

{
  int *piVar1;
  pointer pTVar2;
  
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2[unitNdx].tex1DBinding != (Texture1D *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&(pTVar2[unitNdx].tex1DBinding)->super_Texture);
    pTVar2 = (this->m_textureUnits).
             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2[unitNdx].tex1DBinding = (Texture1D *)0x0;
  }
  if (texture != (Texture1D *)0x0) {
    piVar1 = &(texture->super_Texture).super_NamedObject.m_refCount;
    *piVar1 = *piVar1 + 1;
    pTVar2[unitNdx].tex1DBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTex1DBinding (int unitNdx, Texture1D* texture)
{
	if (m_textureUnits[unitNdx].tex1DBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].tex1DBinding);
		m_textureUnits[unitNdx].tex1DBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].tex1DBinding = texture;
	}
}